

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

void helicsTranslatorSetInfo(HelicsTranslator trans,char *info,HelicsError *err)

{
  Translator *this;
  TranslatorObject *pTVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view info_00;
  
  pTVar1 = getTranslatorObj(trans,err);
  if (pTVar1 != (TranslatorObject *)0x0) {
    this = pTVar1->transPtr;
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (info != (char *)0x0) {
      sVar2 = strlen(info);
      _Var3._M_p = info;
    }
    info_00._M_str = _Var3._M_p;
    info_00._M_len = sVar2;
    helics::Interface::setInfo(&this->super_Interface,info_00);
  }
  return;
}

Assistant:

void helicsTranslatorSetInfo(HelicsTranslator trans, const char* info, HelicsError* err)
{
    auto* transObj = getTranslatorObj(trans, err);
    if (transObj == nullptr) {
        return;
    }
    try {
        transObj->transPtr->setInfo(AS_STRING_VIEW(info));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}